

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_channel
ma_channel_map_init_standard_channel
          (ma_standard_channel_map standardChannelMap,ma_uint32 channelCount,ma_uint32 channelIndex)

{
  char cVar1;
  ma_channel mVar2;
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  
  if (channelCount <= channelIndex) {
    return '\0';
  }
  cVar1 = (char)channelIndex;
  switch(standardChannelMap) {
  case ma_standard_channel_map_alsa:
    switch(channelCount) {
    case 1:
switchD_00144dfd_caseD_1:
      return '\x01';
    case 2:
switchD_00144dfd_caseD_2:
      mVar2 = '\x02';
      if (channelIndex != 0) {
        mVar2 = (channelIndex == 1) * '\x03';
      }
      return mVar2;
    case 3:
switchD_00144dfd_caseD_3:
      if (channelIndex < 3) {
LAB_00144e21:
        return cVar1 + '\x02';
      }
      break;
    case 4:
switchD_00144dcb_caseD_4:
      if (channelIndex < 4) {
        bVar3 = (byte)(channelIndex << 3);
        uVar4 = 0x7060302;
LAB_00144e6b:
        return (ma_channel)(uVar4 >> (bVar3 & 0x1f));
      }
      break;
    case 5:
switchD_00144dcb_caseD_5:
      if (4 < channelIndex) {
        return '\0';
      }
      bVar3 = (byte)(channelIndex << 3);
      uVar5 = 0x407060302;
LAB_00144f9f:
      return (ma_channel)(uVar5 >> (bVar3 & 0x3f));
    case 6:
      if (5 < channelIndex) {
        return '\0';
      }
LAB_00144f15:
      bVar3 = (byte)(channelIndex << 3);
      uVar5 = 0x50407060302;
      goto LAB_00144f9f;
    case 7:
      if (6 < channelIndex) {
        return '\0';
      }
      bVar3 = (byte)(channelIndex << 3);
      uVar5 = 0xa050407060302;
      goto LAB_00144f9f;
    default:
      if (channelIndex < 8) {
        bVar3 = (byte)(channelIndex << 3);
        uVar5 = 0xc0b050407060302;
        goto LAB_00144f9f;
      }
LAB_00144f66:
      if (channelIndex < 0x20 && 8 < channelCount) {
        return cVar1 + '\f';
      }
    }
    return '\0';
  case ma_standard_channel_map_rfc3551:
    switch(channelCount) {
    case 1:
      goto switchD_00144dfd_caseD_1;
    case 2:
      goto switchD_00144dfd_caseD_2;
    case 3:
      goto switchD_00144dfd_caseD_3;
    case 4:
switchD_00144dfd_caseD_4:
      if (3 < channelIndex) {
        return '\0';
      }
      bVar3 = (byte)(channelIndex << 3);
      uVar4 = 0xa040302;
      goto LAB_00144e6b;
    case 5:
switchD_00144dfd_caseD_5:
      if (4 < channelIndex) {
        return '\0';
      }
      bVar3 = (byte)(channelIndex << 3);
      uVar5 = 0x706040302;
      goto LAB_00144f9f;
    default:
      if (5 < channelIndex) {
LAB_00144f24:
        if (0x1f < channelIndex || channelCount < 7) {
          return '\0';
        }
        return cVar1 + '\x0e';
      }
      bVar3 = (byte)(channelIndex << 3);
      uVar5 = 0xa0c03040b02;
      goto LAB_00144f9f;
    }
  case ma_standard_channel_map_flac:
    switch(channelCount) {
    case 1:
      goto switchD_00144dfd_caseD_1;
    case 2:
      goto switchD_00144dfd_caseD_2;
    case 3:
      goto switchD_00144dfd_caseD_3;
    case 4:
      goto switchD_00144dcb_caseD_4;
    case 5:
      goto switchD_00144dfd_caseD_5;
    case 6:
      if (5 < channelIndex) {
        return '\0';
      }
      goto LAB_00144e21;
    case 7:
switchD_00144dfd_caseD_7:
      if (6 < channelIndex) {
        return '\0';
      }
      bVar3 = (byte)(channelIndex << 3);
      uVar5 = 0xc0b0a05040302;
      goto LAB_00144f9f;
    default:
switchD_00144dfd_default:
      if (channelIndex < 8) {
        bVar3 = (byte)(channelIndex << 3);
        uVar5 = 0xc0b070605040302;
        goto LAB_00144f9f;
      }
      goto LAB_00144f66;
    }
  case ma_standard_channel_map_vorbis:
    switch(channelCount) {
    case 1:
      goto switchD_00144dfd_caseD_1;
    case 2:
      goto switchD_00144dfd_caseD_2;
    case 3:
      if (2 < channelIndex) {
        return '\0';
      }
      bVar3 = (byte)(channelIndex << 3);
      uVar4 = 0x30402;
      goto LAB_00144e6b;
    case 4:
      goto switchD_00144dcb_caseD_4;
    case 5:
      if (4 < channelIndex) {
        return '\0';
      }
      bVar3 = (byte)(channelIndex << 3);
      uVar5 = 0x706030402;
      goto LAB_00144f9f;
    case 6:
switchD_00144d37_caseD_6:
      if (5 < channelIndex) {
        return '\0';
      }
      bVar3 = (byte)(channelIndex << 3);
      uVar5 = 0x50706030402;
      goto LAB_00144f9f;
    case 7:
switchD_00144d37_caseD_7:
      if (6 < channelIndex) {
        return '\0';
      }
      bVar3 = (byte)(channelIndex << 3);
      uVar5 = 0x50a0c0b030402;
      goto LAB_00144f9f;
    default:
switchD_00144d37_default:
      if (channelIndex < 8) {
        bVar3 = (byte)(channelIndex << 3);
        uVar5 = 0x507060c0b030402;
        goto LAB_00144f9f;
      }
      goto LAB_00144f66;
    }
  case ma_standard_channel_map_sound4:
    switch(channelCount) {
    case 1:
      goto switchD_00144dfd_caseD_1;
    case 2:
      goto switchD_00144dfd_caseD_2;
    case 3:
      goto switchD_00144dfd_caseD_3;
    case 4:
      goto switchD_00144dcb_caseD_4;
    case 5:
      goto switchD_00144dfd_caseD_5;
    case 6:
      goto switchD_00144d37_caseD_6;
    case 7:
      goto switchD_00144d37_caseD_7;
    default:
      goto switchD_00144d37_default;
    }
  case ma_standard_channel_map_sndio:
    switch(channelCount) {
    case 1:
      goto switchD_00144dfd_caseD_1;
    case 2:
      goto switchD_00144dfd_caseD_2;
    case 3:
      goto switchD_00144dfd_caseD_3;
    case 4:
      goto switchD_00144dcb_caseD_4;
    case 5:
      goto switchD_00144dcb_caseD_5;
    default:
      if (5 < channelIndex) goto LAB_00144f24;
      goto LAB_00144f15;
    }
  default:
    switch(channelCount) {
    case 1:
      goto switchD_00144dfd_caseD_1;
    case 2:
      goto switchD_00144dfd_caseD_2;
    case 3:
      goto switchD_00144dfd_caseD_3;
    case 4:
      goto switchD_00144dfd_caseD_4;
    case 5:
      goto switchD_00144dfd_caseD_5;
    case 6:
      if (5 < channelIndex) {
        return '\0';
      }
      bVar3 = (byte)(channelIndex << 3);
      uVar5 = 0xc0b05040302;
      goto LAB_00144f9f;
    case 7:
      goto switchD_00144dfd_caseD_7;
    default:
      goto switchD_00144dfd_default;
    }
  }
}

Assistant:

static ma_channel ma_channel_map_init_standard_channel(ma_standard_channel_map standardChannelMap, ma_uint32 channelCount, ma_uint32 channelIndex)
{
    if (channelCount == 0 || channelIndex >= channelCount) {
        return MA_CHANNEL_NONE;
    }

    switch (standardChannelMap)
    {
        case ma_standard_channel_map_alsa:
        {
            return ma_channel_map_init_standard_channel_alsa(channelCount, channelIndex);
        } break;

        case ma_standard_channel_map_rfc3551:
        {
            return ma_channel_map_init_standard_channel_rfc3551(channelCount, channelIndex);
        } break;

        case ma_standard_channel_map_flac:
        {
            return ma_channel_map_init_standard_channel_flac(channelCount, channelIndex);
        } break;

        case ma_standard_channel_map_vorbis:
        {
            return ma_channel_map_init_standard_channel_vorbis(channelCount, channelIndex);
        } break;

        case ma_standard_channel_map_sound4:
        {
            return ma_channel_map_init_standard_channel_sound4(channelCount, channelIndex);
        } break;

        case ma_standard_channel_map_sndio:
        {
            return ma_channel_map_init_standard_channel_sndio(channelCount, channelIndex);
        } break;

        case ma_standard_channel_map_microsoft: /* Also default. */
        /*case ma_standard_channel_map_default;*/
        default:
        {
            return ma_channel_map_init_standard_channel_microsoft(channelCount, channelIndex);
        } break;
    }
}